

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O3

int isotree_set_reference_points
              (void *isotree_model,uint8_t with_distances,size_t nrows,uint8_t is_col_major,
              double *numeric_data,size_t ld_numeric,int *categ_data,size_t ld_categ,uint8_t is_csc,
              double *csc_values,int *csc_indices,int *csc_indptr)

{
  int iVar1;
  
  if (isotree_model == (void *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Passed NULL \'isotree_model\' to \'isotree_serialize_to_file\'.",0x3b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    iVar1 = 1;
  }
  else {
    if (csc_indptr == (int *)0x0) {
      isotree::IsolationForest::set_as_reference_points
                ((IsolationForest *)isotree_model,numeric_data,categ_data,is_col_major != '\0',nrows
                 ,ld_numeric,ld_categ,with_distances != '\0');
    }
    else {
      isotree::IsolationForest::set_as_reference_points
                ((IsolationForest *)isotree_model,csc_values,csc_indices,csc_indptr,categ_data,nrows
                 ,with_distances != '\0');
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

ISOTREE_EXPORTED
int isotree_set_reference_points
(
    void* isotree_model,
    uint8_t with_distances,
    size_t nrows,
    uint8_t is_col_major,
    double *numeric_data,
    size_t ld_numeric,
    int *categ_data,
    size_t ld_categ,
    uint8_t is_csc,
    double *csc_values,
    int *csc_indices,
    int *csc_indptr
)
{
    if (!isotree_model) {
        cerr << "Passed NULL 'isotree_model' to 'isotree_serialize_to_file'." << std::endl;
        return IsoTreeError;
    }

    IsolationForest *model = (IsolationForest*)isotree_model;
    try
    {
        if (csc_indptr == NULL)
            model->set_as_reference_points(numeric_data, categ_data, (bool)is_col_major,
                                           nrows, ld_numeric, ld_categ,
                                           (bool)with_distances);
        else
            model->set_as_reference_points(csc_values, csc_indices, csc_indptr, categ_data,
                                           nrows, (bool)with_distances);
        return IsoTreeSuccess;
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
    }

    return IsoTreeError;
}